

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32f1a0::PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
          (PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this,Node **Elem)

{
  Node *pNVar1;
  Node **ppNVar2;
  size_t sVar3;
  Node **Elem_local;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this_local;
  
  if (this->Last == this->Cap) {
    sVar3 = size(this);
    reserve(this,sVar3 << 1);
  }
  pNVar1 = *Elem;
  ppNVar2 = this->Last;
  this->Last = ppNVar2 + 1;
  *ppNVar2 = pNVar1;
  return;
}

Assistant:

void push_back(const T& Elem) {
    if (Last == Cap)
      reserve(size() * 2);
    *Last++ = Elem;
  }